

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

bool benchmarkMany8(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                   pospopcnt_u8_method_type fn,bool verbose,bool test,bool tabular)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint8_t *puVar3;
  pointer puVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  byte bVar11;
  byte bVar12;
  uint32_t uVar13;
  pointer pvVar14;
  string *psVar15;
  uint uVar16;
  result_type rVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  uint32_t uVar21;
  ulong uVar22;
  char *__format;
  undefined7 in_register_00000089;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *x;
  pointer pvVar27;
  bool bVar28;
  bool bVar29;
  ushort uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  pospopcnt_u8_method_type p_Var39;
  undefined1 auVar40 [64];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  vector<double,_std::allocator<double>_> avg;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vdata;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2978;
  double local_2958;
  uint32_t local_2950;
  allocator_type local_2949;
  undefined1 local_2948 [16];
  pointer local_2938;
  pospopcnt_u8_method_type local_2928;
  uint32_t local_2920;
  uint32_t local_291c;
  double local_2918;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2910;
  value_type local_28f8;
  undefined1 local_28d8 [16];
  uint *local_28c8;
  undefined4 local_28b8;
  uint local_28b4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28b0;
  undefined1 local_2898 [16];
  pointer local_2888;
  string *local_2880;
  undefined8 local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  bool bVar26;
  
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2928 = fn;
  local_2920 = n;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2740.field_0,(ulong)n,
             (allocator_type *)&local_13b8);
  local_2958 = (double)(ulong)m;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&local_2910,(size_type)local_2958,(value_type *)&local_2740.field_0,
           (allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  local_2950 = m;
  if (verbose && !tabular) {
    printf("alignments: ");
    pvVar14 = local_2910.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar27 = local_2910.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar27 != pvVar14;
        pvVar27 = pvVar27 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar27->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar27->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  uVar21 = local_2950;
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2978);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_2888 = (pointer)0x0;
  local_2898 = (undefined1  [16])0x0;
  local_28c8 = (uint *)0x0;
  local_28d8 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar16 = std::random_device::_M_getval();
  local_2918 = (double)CONCAT71(local_2918._1_7_,test);
  local_13b8._M_x[0] = (unsigned_long)uVar16;
  lVar19 = 1;
  uVar22 = local_13b8._M_x[0];
  do {
    uVar22 = (ulong)(((uint)(uVar22 >> 0x1e) ^ (uint)uVar22) * 0x6c078965 + (int)lVar19);
    local_13b8._M_x[lVar19] = uVar22;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x270);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xff;
  bVar29 = iterations != 0;
  local_291c = iterations;
  local_2880 = fn_name;
  if (iterations == 0) {
    bVar25 = true;
  }
  else {
    local_28b8 = (undefined4)CONCAT71(in_register_00000089,verbose);
    lVar19 = (long)local_2958 * 0x18;
    bVar26 = true;
    bVar25 = true;
    local_2918 = (double)((ulong)local_2918 ^ 1);
    uVar16 = 0;
    do {
      local_28b4 = uVar16;
      if (local_2910.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_2910.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar22 = 0;
        do {
          if (local_2910.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar22].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_2910.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar22].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar23 = 0;
            do {
              rVar17 = std::uniform_int_distribution<int>::operator()
                                 ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                  &local_2870);
              local_2910.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar22].
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar23] = (uchar)rVar17;
              uVar23 = uVar23 + 1;
            } while (uVar23 < (ulong)((long)local_2910.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_2910.
                                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 < (ulong)(((long)local_2910.
                                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_2910.
                                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2948 = (undefined1  [16])0x0;
      local_2938 = (pointer)0x0;
      local_2948._0_8_ = operator_new(0x20);
      local_2938 = (pointer)(local_2948._0_8_ + 0x20);
      *(undefined8 *)local_2948._0_8_ = 0;
      *(undefined8 *)(local_2948._0_8_ + 8) = 0;
      *(undefined8 *)(local_2948._0_8_ + 0x10) = 0;
      *(undefined8 *)(local_2948._0_8_ + 0x18) = 0;
      local_2948._8_8_ = local_2938;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28b0,(size_type)local_2958,(value_type *)local_2948,
               (allocator_type *)&local_28f8);
      uVar13 = local_2950;
      if ((pointer)local_2948._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2948._0_8_);
      }
      if (uVar13 != 0) {
        lVar24 = 0;
        do {
          puVar3 = *(uint8_t **)
                    ((long)&((local_2910.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar24);
          pospopcnt_u8_scalar_naive
                    (puVar3,*(long *)((long)&((local_2910.
                                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data._M_finish + lVar24) -
                            (long)puVar3,
                     *(uint32_t **)
                      ((long)&((local_28b0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar24));
          lVar24 = lVar24 + 0x18;
        } while (lVar19 != lVar24);
      }
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28f8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x20);
      *(undefined8 *)
       local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = 0;
      *(undefined8 *)
       ((long)local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 8) = 0;
      *(undefined8 *)
       ((long)local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x10) = 0;
      *(undefined8 *)
       ((long)local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + 0x18) = 0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2948,(size_type)local_2958,&local_28f8,&local_2949);
      if (local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_2878 = std::chrono::_V2::system_clock::now();
      LinuxEvents<0>::start(&local_2800);
      if (uVar13 != 0) {
        lVar24 = 0;
        do {
          puVar3 = *(uint8_t **)
                    ((long)&((local_2910.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar24);
          (*local_2928)(puVar3,*(long *)((long)&((local_2910.
                                                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                )._M_impl.super__Vector_impl_data._M_finish + lVar24
                                        ) - (long)puVar3,
                        *(uint32_t **)
                         ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                         lVar24));
          lVar24 = lVar24 + 0x18;
        } while (lVar19 != lVar24);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      iVar18 = std::chrono::_V2::system_clock::now();
      if (uVar13 == 0) {
LAB_0011a2f1:
        bVar28 = false;
      }
      else {
        lVar24 = 0;
        uVar22 = 0;
        do {
          auVar34 = vpmovzxdq_avx512f(**(undefined1 (**) [32])
                                        ((long)&(((
                                                  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)local_2948._0_8_)->_M_impl).
                                                super__Vector_impl_data._M_start + lVar24));
          auVar34 = vpaddq_avx512f(ZEXT864(uVar22),auVar34);
          auVar33 = vextracti64x4_avx512f(auVar34,1);
          auVar34 = vpaddq_avx512f(auVar34,ZEXT3264(auVar33));
          auVar5 = vpaddq_avx(auVar34._0_16_,auVar34._16_16_);
          auVar31 = vpshufd_avx(auVar5,0xee);
          auVar5 = vpaddq_avx(auVar5,auVar31);
          uVar22 = auVar5._0_8_;
          lVar24 = lVar24 + 0x18;
        } while (lVar19 != lVar24);
        if (uVar22 == 0) goto LAB_0011a2f1;
        bVar28 = uVar21 != 0;
        if (uVar13 != 0) {
          dVar20 = 0.0;
          do {
            lVar24 = 0;
            do {
              uVar16 = local_28b0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar20].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar24];
              uVar2 = (((pointer)(local_2948._0_8_ + dVar20 * 0x18))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar24];
              if (uVar16 != uVar2 && local_2918._0_1_ == '\0') {
                puts("bug:");
                printf("expected : ");
                print16(local_28b0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)dVar20].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2948._0_8_ + dVar20 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                goto LAB_0011a2eb;
              }
              bVar25 = bVar26;
              if (uVar16 != uVar2) {
                bVar25 = false;
              }
              lVar24 = lVar24 + 1;
              bVar26 = bVar25;
            } while (lVar24 != 8);
            dVar20 = (double)((long)dVar20 + 1);
            bVar28 = (ulong)dVar20 < (ulong)local_2958;
          } while (dVar20 != local_2958);
        }
LAB_0011a2eb:
        if (bVar28) goto LAB_0011a2f1;
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_2898,(value_type *)local_2868);
        local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = iVar18 - (int)local_2878;
        if ((uint *)local_28d8._8_8_ == local_28c8) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28d8,
                     (iterator)local_28d8._8_8_,(uint *)&local_28f8);
        }
        else {
          *(int *)local_28d8._8_8_ = iVar18 - (int)local_2878;
          local_28d8._8_8_ = (uint *)(local_28d8._8_8_ + 4);
        }
        bVar28 = true;
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2948);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28b0);
      if (!bVar28) break;
      uVar16 = local_28b4 + 1;
      bVar29 = uVar16 < local_291c;
    } while (uVar16 != local_291c);
    verbose = SUB41(local_28b8,0);
    uVar21 = local_2950;
  }
  if (bVar29) {
    bVar25 = false;
  }
  else {
    if (local_28d8._0_8_ == local_28d8._8_8_) {
      uVar22 = 0;
    }
    else {
      auVar34 = vpbroadcastq_avx512f();
      uVar22 = ((ulong)(local_28d8._8_8_ + (-4 - local_28d8._0_8_)) >> 2) + 0x10 &
               0xfffffffffffffff0;
      auVar34 = vpsrlq_avx512f(auVar34,2);
      auVar40 = ZEXT1664((undefined1  [16])0x0);
      uVar23 = 0;
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar37 = vmovdqa64_avx512f(auVar40);
        auVar40 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar40,auVar35);
        auVar40 = vporq_avx512f(auVar40,auVar36);
        uVar6 = vpcmpuq_avx512f(auVar40,auVar34,2);
        bVar11 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar38,auVar34,2);
        bVar12 = (byte)uVar6;
        uVar30 = CONCAT11(bVar12,bVar11);
        auVar40 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_28d8._0_8_ + uVar23 * 4));
        auVar38._4_4_ = (uint)((byte)(uVar30 >> 1) & 1) * auVar40._4_4_;
        auVar38._0_4_ = (uint)(bVar11 & 1) * auVar40._0_4_;
        auVar38._8_4_ = (uint)((byte)(uVar30 >> 2) & 1) * auVar40._8_4_;
        auVar38._12_4_ = (uint)((byte)(uVar30 >> 3) & 1) * auVar40._12_4_;
        auVar38._16_4_ = (uint)((byte)(uVar30 >> 4) & 1) * auVar40._16_4_;
        auVar38._20_4_ = (uint)((byte)(uVar30 >> 5) & 1) * auVar40._20_4_;
        auVar38._24_4_ = (uint)((byte)(uVar30 >> 6) & 1) * auVar40._24_4_;
        auVar38._28_4_ = (uint)((byte)(uVar30 >> 7) & 1) * auVar40._28_4_;
        auVar38._32_4_ = (uint)(bVar12 & 1) * auVar40._32_4_;
        auVar38._36_4_ = (uint)(bVar12 >> 1 & 1) * auVar40._36_4_;
        auVar38._40_4_ = (uint)(bVar12 >> 2 & 1) * auVar40._40_4_;
        auVar38._44_4_ = (uint)(bVar12 >> 3 & 1) * auVar40._44_4_;
        auVar38._48_4_ = (uint)(bVar12 >> 4 & 1) * auVar40._48_4_;
        auVar38._52_4_ = (uint)(bVar12 >> 5 & 1) * auVar40._52_4_;
        auVar38._56_4_ = (uint)(bVar12 >> 6 & 1) * auVar40._56_4_;
        auVar38._60_4_ = (uint)(bVar12 >> 7) * auVar40._60_4_;
        auVar40 = vpaddd_avx512f(auVar38,auVar37);
        uVar23 = uVar23 + 0x10;
      } while (uVar22 != uVar23);
      auVar34 = vmovdqa32_avx512f(auVar40);
      auVar35._0_4_ = (uint)(bVar11 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar37._0_4_
      ;
      bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar29 * auVar34._4_4_ | (uint)!bVar29 * auVar37._4_4_;
      bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar29 * auVar34._8_4_ | (uint)!bVar29 * auVar37._8_4_;
      bVar29 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar29 * auVar34._12_4_ | (uint)!bVar29 * auVar37._12_4_;
      bVar29 = (bool)((byte)(uVar30 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar29 * auVar34._16_4_ | (uint)!bVar29 * auVar37._16_4_;
      bVar29 = (bool)((byte)(uVar30 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar29 * auVar34._20_4_ | (uint)!bVar29 * auVar37._20_4_;
      bVar29 = (bool)((byte)(uVar30 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar29 * auVar34._24_4_ | (uint)!bVar29 * auVar37._24_4_;
      bVar29 = (bool)((byte)(uVar30 >> 7) & 1);
      auVar35._28_4_ = (uint)bVar29 * auVar34._28_4_ | (uint)!bVar29 * auVar37._28_4_;
      auVar35._32_4_ =
           (uint)(bVar12 & 1) * auVar34._32_4_ | (uint)!(bool)(bVar12 & 1) * auVar37._32_4_;
      bVar29 = (bool)(bVar12 >> 1 & 1);
      auVar35._36_4_ = (uint)bVar29 * auVar34._36_4_ | (uint)!bVar29 * auVar37._36_4_;
      bVar29 = (bool)(bVar12 >> 2 & 1);
      auVar35._40_4_ = (uint)bVar29 * auVar34._40_4_ | (uint)!bVar29 * auVar37._40_4_;
      bVar29 = (bool)(bVar12 >> 3 & 1);
      auVar35._44_4_ = (uint)bVar29 * auVar34._44_4_ | (uint)!bVar29 * auVar37._44_4_;
      bVar29 = (bool)(bVar12 >> 4 & 1);
      auVar35._48_4_ = (uint)bVar29 * auVar34._48_4_ | (uint)!bVar29 * auVar37._48_4_;
      bVar29 = (bool)(bVar12 >> 5 & 1);
      auVar35._52_4_ = (uint)bVar29 * auVar34._52_4_ | (uint)!bVar29 * auVar37._52_4_;
      bVar29 = (bool)(bVar12 >> 6 & 1);
      auVar35._56_4_ = (uint)bVar29 * auVar34._56_4_ | (uint)!bVar29 * auVar37._56_4_;
      auVar35._60_4_ =
           (uint)(bVar12 >> 7) * auVar34._60_4_ | (uint)!(bool)(bVar12 >> 7) * auVar37._60_4_;
      auVar33 = vextracti64x4_avx512f(auVar35,1);
      auVar34 = vpaddd_avx512f(auVar35,ZEXT3264(auVar33));
      auVar5 = vpaddd_avx(auVar34._0_16_,auVar34._16_16_);
      auVar31 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpaddd_avx(auVar5,auVar31);
      auVar31 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpaddd_avx(auVar5,auVar31);
      uVar22 = CONCAT44((int)(uVar22 >> 0x20),auVar5._0_4_);
    }
    lVar19 = local_28d8._8_8_ - local_28d8._0_8_;
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2830,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_2898);
    compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28b0,
                 &local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2830);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector(&local_2848,
             (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)local_2898);
    compute_averages((vector<double,_std::allocator<double>_> *)local_2948,&local_2848);
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector(&local_2848);
    psVar15 = local_2880;
    auVar5._8_8_ = in_XMM6_Qb;
    auVar5._0_8_ = in_XMM6_Qa;
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_2920);
    dVar20 = auVar5._0_8_ * 9.5367431640625e-07;
    if (tabular) {
      if (local_291c != 0) {
        auVar7._8_8_ = in_XMM6_Qb;
        auVar7._0_8_ = in_XMM6_Qa;
        auVar5 = vcvtusi2sd_avx512f(auVar7,uVar21 * local_2920);
        local_2958 = auVar5._0_8_;
        uVar22 = (ulong)local_291c;
        uVar23 = 0;
        local_2918 = dVar20;
        do {
          auVar8._8_8_ = in_XMM6_Qb;
          auVar8._0_8_ = in_XMM6_Qa;
          auVar5 = vcvtusi2sd_avx512f(auVar8,*(pointer)(local_28d8._0_8_ + uVar23 * 4));
          local_2928 = (pospopcnt_u8_method_type)(local_2918 / (auVar5._0_8_ / 1000000000.0));
          printf("%s\t%u\t%d\t",(psVar15->_M_dataplus)._M_p,(ulong)local_2920,uVar23 & 0xffffffff);
          auVar31 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                         (((pointer)(local_2898._0_8_ + uVar23 * 0x18))->
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
          auVar5 = vshufpd_avx(auVar31,auVar31,1);
          printf("%4.2f\t%4.3f\t%4.3f\t",auVar5._0_8_ / auVar31._0_8_,auVar31._0_8_ / local_2958,
                 auVar5._0_8_ / local_2958);
          puVar4 = (((pointer)(local_2898._0_8_ + uVar23 * 0x18))->
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar4,puVar4[1],puVar4[2],puVar4[3],puVar4[4]);
          printf("%u\t%4.2f\n",local_2928,(ulong)*(uint *)(local_28d8._0_8_ + uVar23 * 4));
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar22);
      }
    }
    else {
      if (verbose == false) {
        auVar31._8_8_ = in_XMM6_Qb;
        auVar31._0_8_ = in_XMM6_Qa;
        auVar31 = vcvtusi2sd_avx512f(auVar31,((local_28b0.
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start);
        auVar32._8_8_ = in_XMM6_Qb;
        auVar32._0_8_ = in_XMM6_Qa;
        auVar5 = vcvtusi2sd_avx512f(auVar32,uVar21 * local_2920);
        dVar20 = auVar31._0_8_ / auVar5._0_8_;
        auVar10._8_8_ = in_XMM6_Qb;
        auVar10._0_8_ = in_XMM6_Qa;
        auVar31 = vcvtusi2sd_avx512f(auVar10,local_28b0.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        p_Var39 = (pospopcnt_u8_method_type)(auVar31._0_8_ / auVar5._0_8_);
        __format = "cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n";
      }
      else {
        local_2958 = (double)(uVar22 / (ulong)(lVar19 >> 2));
        local_2928 = (pospopcnt_u8_method_type)(dVar20 / (local_2958 / 1000000000.0));
        auVar1._0_8_ = ((local_28b0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
        auVar1._8_8_ = ((local_28b0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
        auVar32 = vcvtuqq2pd_avx512vl(auVar1);
        auVar5 = vshufpd_avx(auVar32,auVar32,1);
        auVar9._8_8_ = in_XMM6_Qb;
        auVar9._0_8_ = in_XMM6_Qa;
        auVar31 = vcvtusi2sd_avx512f(auVar9,uVar21 * local_2920);
        printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, instructions per 8-bit word %4.3f \n"
               ,auVar5._0_8_ / auVar32._0_8_,auVar32._0_8_ / auVar31._0_8_,
               auVar5._0_8_ / auVar31._0_8_);
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
               ,((local_28b0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,
               ((local_28b0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               ((local_28b0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage,
               local_28b0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_28b0.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
               ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
                _M_impl).super__Vector_impl_data._M_start,
               (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
               _M_impl).super__Vector_impl_data._M_finish,
               (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
               _M_impl).super__Vector_impl_data._M_end_of_storage,
               (((pointer)(local_2948._0_8_ + 0x18))->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (((pointer)(local_2948._0_8_ + 0x18))->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
        __format = "avg time: %f ns, %4.2f mb/s\n";
        dVar20 = local_2958;
        p_Var39 = local_2928;
      }
      printf(__format,dVar20,p_Var39);
    }
    if ((pointer)local_2948._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_2948._0_8_);
    }
    if (local_28b0.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28b0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::random_device::_M_fini();
  if ((pointer)local_28d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_28d8._0_8_);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_2898);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_2910);
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar25;
}

Assistant:

bool benchmarkMany8(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u8_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>> vdata(m, std::vector<uint8_t,AlignedSTLAllocator<uint8_t,64>>(n));
#else
    std::vector<std::vector<uint8_t>> vdata(m, std::vector<uint8_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(8));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u8_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(8));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 8; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 8; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = (n / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = (n / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 8-bit word:  %4.3f, "
               "instructions per 8-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 8-bit word:  %4.3f; ref cycles per 8-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}